

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fd.cc
# Opt level: O0

int fd_gets(BIO *bp,char *buf,int size)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  char c;
  char *end;
  char *ptr;
  int size_local;
  char *buf_local;
  BIO *bp_local;
  
  if (size < 1) {
    bp_local._4_4_ = 0;
  }
  else {
    end = buf;
    do {
      bVar2 = false;
      if (end < buf + (long)size + -1) {
        iVar3 = fd_read(bp,end,1);
        bVar2 = 0 < iVar3;
      }
    } while ((bVar2) && (cVar1 = *end, end = end + 1, cVar1 != '\n'));
    *end = '\0';
    bp_local._4_4_ = (int)end - (int)buf;
  }
  return bp_local._4_4_;
}

Assistant:

static int fd_gets(BIO *bp, char *buf, int size) {
  if (size <= 0) {
    return 0;
  }

  char *ptr = buf;
  char *end = buf + size - 1;
  while (ptr < end && fd_read(bp, ptr, 1) > 0) {
    char c = ptr[0];
    ptr++;
    if (c == '\n') {
      break;
    }
  }

  ptr[0] = '\0';

  // The output length is bounded by |size|.
  return (int)(ptr - buf);
}